

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorTable.cpp
# Opt level: O1

Vector * __thiscall
ColorTable::find_color(Vector *__return_storage_ptr__,ColorTable *this,double value)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Entry *pEVar4;
  double dVar5;
  ulong uVar6;
  ulong uVar7;
  Entry *pEVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  
  uVar6 = (ulong)this->color_entries;
  if ((long)uVar6 < 1) {
    __return_storage_ptr__->x = 0.0;
    __return_storage_ptr__->y = 0.0;
    __return_storage_ptr__->z = 0.0;
    return __return_storage_ptr__;
  }
  pEVar4 = this->entries;
  if (value <= pEVar4->ta) {
    __return_storage_ptr__->x = (pEVar4->ca).x;
    __return_storage_ptr__->y = (pEVar4->ca).y;
    dVar12 = (pEVar4->ca).z;
    uVar10 = SUB84(dVar12,0);
    uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
  }
  else {
    dVar12 = pEVar4->tb;
    pEVar8 = pEVar4;
    if (value <= dVar12) {
      bVar9 = true;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if ((ulong)(uint)this->color_entries - 1 == uVar7) goto LAB_0010398b;
        dVar12 = pEVar8[1].tb;
        pEVar8 = pEVar8 + 1;
        uVar7 = uVar7 + 1;
      } while (dVar12 < value);
      bVar9 = uVar7 < uVar6;
    }
    dVar5 = (value - pEVar8->ta) / (dVar12 - pEVar8->ta);
    dVar13 = 1.0 - dVar5;
    dVar12 = pEVar4[uVar7].ca.y;
    dVar1 = pEVar4[uVar7].ca.z;
    dVar2 = pEVar4[uVar7].cb.y;
    dVar3 = pEVar4[uVar7].cb.z;
    __return_storage_ptr__->x = pEVar4[uVar7].cb.x * dVar5 + pEVar4[uVar7].ca.x * dVar13;
    __return_storage_ptr__->y = dVar2 * dVar5 + dVar12 * dVar13;
    __return_storage_ptr__->z = dVar5 * dVar3 + dVar13 * dVar1;
    if (bVar9) {
      return __return_storage_ptr__;
    }
LAB_0010398b:
    __return_storage_ptr__->x = pEVar4[uVar6 - 1].cb.x;
    __return_storage_ptr__->y = pEVar4[uVar6 - 1].cb.y;
    dVar12 = pEVar4[uVar6 - 1].cb.z;
    uVar10 = SUB84(dVar12,0);
    uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
  }
  __return_storage_ptr__->z = (double)CONCAT44(uVar11,uVar10);
  return __return_storage_ptr__;
}

Assistant:

Vector ColorTable::find_color(double value)
{
   if (color_entries < 1) return Vector(0);

   if (value <= entries[0].ta) return entries[0].ca;

   for (int i = 0; i < color_entries; ++i)
      if (value <= entries[i].tb)
      {
         double t = (value - entries[i].ta)/(entries[i].tb-entries[i].ta);
         return entries[i].ca*(1-t)+entries[i].cb*t;
         //Entries[i].ca+t*(Entries[i].cb-Entries[i].ca);
      }
   return entries[color_entries - 1].cb;
}